

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O3

bool __thiscall FScriptLoader::ParseInfo(FScriptLoader *this,MapData *map)

{
  FileReader *pFVar1;
  FOptionalMapinfoData *pFVar2;
  level_info_t *plVar3;
  Node *pNVar4;
  int lump;
  int iVar5;
  uint uVar6;
  char *dest;
  DFraggleThinker *this_00;
  char *pcVar7;
  Node *pNVar8;
  undefined1 uVar9;
  byte bVar10;
  long lVar11;
  char *pcVar12;
  FString scriptsrc;
  FString local_38;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_38.Chars = FString::NullString.Nothing;
  this->IgnoreInfo = false;
  pFVar1 = map->MapLumps[0].Reader;
  if ((pFVar1 == (FileReader *)0x0) || (iVar5 = (int)pFVar1->Length, iVar5 == 0)) {
    lump = FWadCollection::CheckNumForName(&Wads,"FSGLOBAL",0);
    if (-1 < lump) {
      iVar5 = FWadCollection::LumpLength(&Wads,lump);
      if (iVar5 != 0) {
        dest = (char *)operator_new__((long)(iVar5 + 3));
        FWadCollection::ReadLump(&Wads,lump,dest);
        bVar10 = 1;
        goto LAB_0050d572;
      }
    }
    uVar9 = 0;
  }
  else {
    lVar11 = pFVar1->Length << 0x20;
    dest = (char *)operator_new__(lVar11 + 0x300000000 >> 0x20);
    map->file = pFVar1;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,0,0);
    (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,dest,lVar11 >> 0x20);
    bVar10 = 0;
LAB_0050d572:
    (dest + iVar5)[0] = '\n';
    (dest + iVar5)[1] = '\r';
    dest[(long)iVar5 + 2] = '\0';
    this->HasScripts = false;
    this->readtype = RT_OTHER;
    this->drownflag = -1;
    if (-2 < iVar5) {
      pcVar7 = dest;
      pcVar12 = dest;
      do {
        if (*pcVar12 == '\n') {
          *pcVar12 = '\0';
          if (this->IgnoreInfo == false) {
            ParseInfoCmd(this,pcVar7,&local_38);
          }
          pcVar7 = pcVar12 + 1;
          *pcVar12 = '\n';
        }
        pcVar12 = pcVar12 + 1;
      } while (pcVar12 < dest + (long)iVar5 + 2);
      if ((this->HasScripts & 1U) != 0) {
        this_00 = (DFraggleThinker *)
                  M_Malloc_Dbg(0x60,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                               ,0x1f9);
        DFraggleThinker::DFraggleThinker(this_00);
        pcVar7 = copystring(local_38.Chars);
        *(char **)(*(long *)((long)DFraggleThinker::ActiveThinker.field_0 + 0x38) + 0x28) = pcVar7;
        uVar6 = this->drownflag;
        if (uVar6 == 0xffffffff) {
          uVar6 = (uint)(bVar10 | level.maptype != MAPTYPE_DOOM);
          this->drownflag = uVar6;
        }
        plVar3 = level.info;
        if (uVar6 == 0) {
          level.airsupply = 0;
        }
        uVar6 = FName::NameManager::FindName(&FName::NameData,"fragglescript",false);
        pNVar4 = (plVar3->optdata).Nodes + ((plVar3->optdata).Size - 1 & uVar6);
        do {
          pNVar8 = pNVar4;
          if ((pNVar8 == (Node *)0x0) || (pNVar8->Next == (Node *)0x1)) goto LAB_0050d6ba;
          pNVar4 = pNVar8->Next;
        } while ((pNVar8->Pair).Key.Index != uVar6);
        pFVar2 = (pNVar8->Pair).Value.Ptr;
        if (pFVar2 != (FOptionalMapinfoData *)0x0) {
          *(undefined1 *)((long)DFraggleThinker::ActiveThinker.field_0 + 0x58) = pFVar2->field_0x14;
        }
      }
    }
LAB_0050d6ba:
    operator_delete__(dest);
    uVar9 = this->HasScripts;
  }
  FString::~FString(&local_38);
  return (bool)uVar9;
}

Assistant:

bool FScriptLoader::ParseInfo(MapData * map)
{
	char *lump;
	char *rover;
	char *startofline;
	int lumpsize;
	bool fsglobal=false;
	FString scriptsrc;

	// Global initializazion if not done yet.
	static bool done=false;
					
	// Load the script lump
	IgnoreInfo = false;
	lumpsize = map->Size(0);
	if (lumpsize==0)
	{
		// Try a global FS lump
		int lumpnum=Wads.CheckNumForName("FSGLOBAL");
		if (lumpnum<0) return false;
		lumpsize=Wads.LumpLength(lumpnum);
		if (lumpsize==0) return false;
		fsglobal=true;
		lump=new char[lumpsize+3];
		Wads.ReadLump(lumpnum,lump);
	}
	else
	{
		lump=new char[lumpsize+3];
		map->Read(0, lump);
	}
	// Append a new line. The parser likes to crash when the last character is a valid token.
	lump[lumpsize]='\n';
	lump[lumpsize+1]='\r';
	lump[lumpsize+2]=0;
	lumpsize+=2;
	
	rover = startofline = lump;
	HasScripts=false;
	drownflag=-1;

	readtype = RT_OTHER;
	while(rover < lump+lumpsize)
    {
		if(*rover == '\n') // end of line
		{
			*rover = 0;               // make it an end of string (0)
			if (!IgnoreInfo) ParseInfoCmd(startofline, scriptsrc);
			startofline = rover+1; // next line
			*rover = '\n';            // back to end of line
		}
		rover++;
    }
	if (HasScripts) 
	{
		new DFraggleThinker;
		DFraggleThinker::ActiveThinker->LevelScript->data = copystring(scriptsrc.GetChars());

		if (drownflag==-1) drownflag = (level.maptype != MAPTYPE_DOOM || fsglobal);
		if (!drownflag) level.airsupply=0;	// Legacy doesn't to water damage so we need to check if it has to be disabled here.

		FFsOptions *opt = level.info->GetOptData<FFsOptions>("fragglescript", false);
		if (opt != NULL)
		{
			DFraggleThinker::ActiveThinker->nocheckposition = opt->nocheckposition;
		}
	}


	delete[] lump;
	return HasScripts;
}